

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

JointActionObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryTree
          (PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  pointer ppJVar1;
  Index IVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr *pp_Var5;
  _Rb_tree_header *p_Var6;
  
  if ((this->_m_params)._m_jointActionObservationHistories == true) {
    IVar2 = Globals::CastLIndexToIndex(jaohI);
    ppJVar1 = (this->_m_jointActionObservationHistoryTreeVector).
              super__Vector_base<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_m_jointActionObservationHistoryTreeVector).
                      super__Vector_base<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar1 >> 3) <=
        (ulong)IVar2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    pp_Var5 = (_Base_ptr *)(ppJVar1 + IVar2);
  }
  else {
    p_Var6 = &(this->_m_jointActionObservationHistoryTreeMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = (this->_m_jointActionObservationHistoryTreeMap)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent;
    p_Var3 = &p_Var6->_M_header;
    for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < jaohI]) {
      if (*(ulong *)(p_Var4 + 1) >= jaohI) {
        p_Var3 = p_Var4;
      }
    }
    p_Var4 = &p_Var6->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var6) && (p_Var4 = p_Var3, jaohI < *(ulong *)(p_Var3 + 1)))
    {
      p_Var4 = &p_Var6->_M_header;
    }
    if ((_Rb_tree_header *)p_Var4 == p_Var6) {
      return (JointActionObservationHistoryTree *)0x0;
    }
    pp_Var5 = &p_Var4[1]._M_parent;
  }
  return (JointActionObservationHistoryTree *)*pp_Var5;
}

Assistant:

JointActionObservationHistoryTree* 
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryTree(LIndex jaohI)
    const
{
    if(_m_params.GetComputeJointActionObservationHistories())
        return(_m_jointActionObservationHistoryTreeVector.at(CastLIndexToIndex(jaohI)));
    else
    {
        // cannot use m_jointActionObservationHistoryTreeMap[jaohI],
        // it violates the const, as it creates an empty object if
        // jaohI does not exist yet
        map<LIndex,JointActionObservationHistoryTree*>::const_iterator cit
            = _m_jointActionObservationHistoryTreeMap.find(jaohI);
        if(cit!=_m_jointActionObservationHistoryTreeMap.end())
            return(cit->second);
        else
        {
            return(0);
//            throw(E("GetJointActionObservationHistoryTree:: index not found in map"));
        }
    }
}